

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_rawgeti(lua_State *L,int idx,lua_Integer n)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  TValue *pTVar4;
  
  pTVar4 = index2addr(L,idx);
  pTVar1 = L->top;
  pTVar4 = luaH_getint((Table *)(pTVar4->value_).gc,n);
  iVar2 = pTVar4->tt_;
  uVar3 = *(undefined4 *)&pTVar4->field_0xc;
  pTVar1->value_ = pTVar4->value_;
  pTVar1->tt_ = iVar2;
  *(undefined4 *)&pTVar1->field_0xc = uVar3;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  return pTVar1->tt_ & 0xf;
}

Assistant:

LUA_API int lua_rawgeti(lua_State *L, int idx, lua_Integer n) {
    StkId t;
    lua_lock(L);
    t = index2addr(L, idx);
    api_check(L, ttistable(t), "table expected");
    setobj2s(L, L->top, luaH_getint(hvalue(t), n));
    api_incr_top(L);
    lua_unlock(L);
    return ttnov(L->top - 1);
}